

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::media_fragment::print(media_fragment *this)

{
  pointer peVar1;
  long lVar2;
  undefined8 in_RSI;
  long *plVar3;
  int i;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    peVar1 = (this->emsg_).super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(this->emsg_).
                  super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)peVar1;
    if ((ulong)(lVar2 / 0xe0) <= uVar4) break;
    if ((*(long *)((long)&((string *)(&peVar1->super_full_box + 1))->_M_string_length + lVar5) != 0)
       && (this->e_msg_is_in_mdat_ == false)) {
      plVar3 = (long *)((long)(peVar1->super_full_box).super_box.extended_type_ +
                       lVar5 + 0xffffffffffffffc8U);
      (**(code **)(*plVar3 + 8))(plVar3,in_RSI,lVar2 % 0xe0);
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0xe0;
  }
  box::print(&this->moof_box_);
  mfhd::print(&this->mfhd_);
  tfhd::print(&this->tfhd_);
  tfdt::print(&this->tfdt_);
  trun::print(&this->trun_);
  box::print(&this->mdat_box_);
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    peVar1 = (this->emsg_).super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(this->emsg_).
                  super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)peVar1;
    if ((ulong)(lVar2 / 0xe0) <= uVar4) break;
    if ((*(long *)((long)&((string *)(&peVar1->super_full_box + 1))->_M_string_length + lVar5) != 0)
       && (this->e_msg_is_in_mdat_ == true)) {
      plVar3 = (long *)((long)(peVar1->super_full_box).super_box.extended_type_ +
                       lVar5 + 0xffffffffffffffc8U);
      (**(code **)(*plVar3 + 8))(plVar3,in_RSI,lVar2 % 0xe0);
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0xe0;
  }
  return;
}

Assistant:

void media_fragment::print() const
	{
		for(int i=0;i<emsg_.size();i++)
		    if (emsg_[i].scheme_id_uri_.size() && !this->e_msg_is_in_mdat_)
			   emsg_[i].print();

		moof_box_.print(); // moof box size
		mfhd_.print(); // moof box header
		tfhd_.print(); // track fragment header
		tfdt_.print(); // track fragment decode time
		trun_.print(); // trun box
		mdat_box_.print(); // mdat 

		for (int i = 0; i<emsg_.size(); i++)
		    if (emsg_[i].scheme_id_uri_.size() && this->e_msg_is_in_mdat_)
			    emsg_[i].print();
	}